

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

int * __thiscall
google::protobuf::internal::ExtensionSet::GetRefEnum
          (ExtensionSet *this,int number,int *default_value)

{
  bool bVar1;
  int iVar2;
  AllocatedData AVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  Extension *pEVar4;
  uint *puVar5;
  string *psVar6;
  uint in_ECX;
  uint uVar7;
  uint extraout_EDX;
  int index;
  undefined1 *puVar8;
  ExtensionSet *pEVar9;
  LogMessageFatal *pLVar10;
  FieldDescriptor *in_R8;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar11;
  LogMessageFatal aLStack_80 [16];
  ulong uStack_70;
  Extension *pEStack_68;
  ExtensionSet EStack_58;
  undefined1 local_20 [16];
  
  AVar3.flat = (KeyValue *)FindOrNull(this,number);
  if (AVar3.flat == (KeyValue *)0x0) {
    return default_value;
  }
  if ((((AVar3.flat)->second).field_0.uint64_t_value & 0x20000) != 0) {
    return default_value;
  }
  if (*(bool *)((long)&((AVar3.flat)->second).field_0 + 1) == false) {
    psVar6 = (string *)0x0;
  }
  else {
    psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (psVar6 == (string *)0x0) {
    bVar1 = ((AVar3.flat)->second).field_0.bool_value;
    uVar7 = bVar1 - 0x13;
    if ((byte)uVar7 < 0xee) {
      puVar8 = local_20;
      GetRefEnum();
LAB_0025bc98:
      in_ECX = uVar7;
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)puVar8,8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    else {
      in_ECX = 0x439360;
      puVar8 = (undefined1 *)
               (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4);
      uVar7 = 0x439360;
      if (puVar8 != (undefined1 *)0x8) goto LAB_0025bc98;
      psVar6 = (string *)0x0;
    }
    if (psVar6 == (string *)0x0) {
      return &((KeyValue *)AVar3)->first;
    }
  }
  else {
    GetRefEnum();
    psVar6 = extraout_RAX;
  }
  iVar2 = (int)psVar6;
  pEVar9 = (ExtensionSet *)local_20;
  GetRefEnum();
  pEStack_68 = (Extension *)0x25bcde;
  EStack_58.map_.flat = AVar3.flat;
  pVar11 = Insert(pEVar9,iVar2);
  pEVar4 = pVar11.first;
  pEVar4->descriptor = in_R8;
  if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar4->is_repeated != false) goto LAB_0025bd7d;
    psVar6 = (string *)0x0;
LAB_0025bd2e:
    if (psVar6 != (string *)0x0) {
      pEStack_68 = (Extension *)0x25bdd2;
      SetEnum();
      goto LAB_0025bdd2;
    }
    if ((byte)(pEVar4->type - 0x13) < 0xee) {
      pEVar9 = &EStack_58;
      pEStack_68 = (Extension *)0x25bd9c;
      SetEnum(pEVar9);
      goto LAB_0025bd9c;
    }
    if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4) == 8) {
      psVar6 = (string *)0x0;
    }
    else {
      pEStack_68 = (Extension *)0x25bdc3;
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                          (ulong)pEVar4->type * 4),8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    if (psVar6 == (string *)0x0) goto LAB_0025bd5f;
  }
  else {
    pEVar4->type = (FieldType)extraout_EDX;
    if ((byte)((FieldType)extraout_EDX - 0x13) < 0xee) {
      pEStack_68 = (Extension *)0x25bd7d;
      SetEnum(&EStack_58);
LAB_0025bd7d:
      pEStack_68 = (Extension *)0x25bd90;
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (0,1,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
      goto LAB_0025bd2e;
    }
    pEVar9 = (ExtensionSet *)
             (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                             (ulong)(extraout_EDX & 0xff) * 4);
    if (pEVar9 == (ExtensionSet *)0x8) {
      psVar6 = (string *)0x0;
    }
    else {
LAB_0025bd9c:
      pEStack_68 = (Extension *)0x25bdad;
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pEVar9,8,"cpp_type(extension->type) == WireFormatLite::CPPTYPE_ENUM"
                         );
    }
    if (psVar6 == (string *)0x0) {
      pEVar4->is_repeated = false;
      pEVar4->field_0xa = pEVar4->field_0xa & 0xfe;
      psVar6 = (string *)0x0;
LAB_0025bd5f:
      pEVar4->field_0xa = pEVar4->field_0xa & 0xfd;
      (pEVar4->field_0).uint32_t_value = in_ECX;
      return (int *)psVar6;
    }
LAB_0025bdd2:
    pEStack_68 = (Extension *)0x25bddf;
    SetEnum();
    psVar6 = extraout_RAX_00;
  }
  iVar2 = (int)psVar6;
  pEVar9 = &EStack_58;
  pEStack_68 = (Extension *)GetRepeatedEnum;
  SetEnum();
  uStack_70 = (ulong)in_ECX;
  pEStack_68 = pEVar4;
  pEVar4 = FindOrNull(pEVar9,iVar2);
  if (pEVar4 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_80,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x1f8,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_80,0x25,"Index out-of-bounds (field is empty).");
    goto LAB_0025bee4;
  }
  if (pEVar4->is_repeated == false) {
    psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (1,0,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
  }
  else {
    psVar6 = (string *)0x0;
  }
  if (psVar6 == (string *)0x0) {
    if ((byte)(pEVar4->type - 0x13) < 0xee) {
      pLVar10 = aLStack_80;
      GetRepeatedEnum();
LAB_0025beb4:
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pLVar10,8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    else {
      pLVar10 = (LogMessageFatal *)
                (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4);
      if (pLVar10 != (LogMessageFatal *)0x8) goto LAB_0025beb4;
      psVar6 = (string *)0x0;
    }
    if (psVar6 == (string *)0x0) {
      puVar5 = (uint *)RepeatedField<int>::Get((RepeatedField<int> *)pEVar4->field_0,index);
      return (int *)(ulong)*puVar5;
    }
  }
  else {
    GetRepeatedEnum();
  }
  GetRepeatedEnum();
LAB_0025bee4:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_80);
}

Assistant:

const int& ExtensionSet::GetRefEnum(int number,
                                    const int& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}